

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamDens.cpp
# Opt level: O0

void __thiscall OpenMD::TetrahedralityParamDens::process(TetrahedralityParamDens *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  SnapshotManager *this_00;
  Snapshot *pSVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  ostream *this_01;
  long in_RDI;
  __type _Var11;
  int binNo;
  int j;
  int i;
  int nang;
  int nbors;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int isd2;
  int isd1;
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  myNeighbors;
  RealType Qk;
  RealType cospsi;
  RealType r;
  Vector3d rkj;
  Vector3d rik;
  Vector3d rk;
  Vector3d rj;
  Vector3d ri;
  Vector3d vec;
  int myIndex;
  StuntDouble *sdj;
  StuntDouble *sdi;
  StuntDouble *sd2;
  StuntDouble *sd;
  Snapshot *in_stack_ffffffffffffea88;
  DumpReader *in_stack_ffffffffffffea90;
  __normal_iterator<std::pair<double,_OpenMD::StuntDouble_*>_*,_std::vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>_>
  in_stack_ffffffffffffea98;
  __normal_iterator<std::pair<double,_OpenMD::StuntDouble_*>_*,_std::vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>_>
  in_stack_ffffffffffffeaa0;
  SelectionEvaluator *in_stack_ffffffffffffeac8;
  undefined4 in_stack_ffffffffffffeb08;
  long in_stack_ffffffffffffeb18;
  undefined7 in_stack_ffffffffffffeb20;
  undefined1 in_stack_ffffffffffffeb27;
  int local_1464;
  int local_142c;
  int local_1370;
  string *in_stack_ffffffffffffece0;
  SimInfo *in_stack_ffffffffffffece8;
  DumpReader *in_stack_ffffffffffffecf0;
  TetrahedralityParamDens *in_stack_ffffffffffffed10;
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  local_f0;
  double local_d8;
  double local_d0;
  double local_c8;
  int local_2c;
  StuntDouble *local_28;
  StuntDouble *local_20;
  StuntDouble *local_18;
  Snapshot *local_10;
  
  Vector3<double>::Vector3((Vector3<double> *)0x1e0ebc);
  Vector3<double>::Vector3((Vector3<double> *)0x1e0ec9);
  Vector3<double>::Vector3((Vector3<double> *)0x1e0ed6);
  Vector3<double>::Vector3((Vector3<double> *)0x1e0ee3);
  Vector3<double>::Vector3((Vector3<double> *)0x1e0ef0);
  Vector3<double>::Vector3((Vector3<double> *)0x1e0efd);
  std::
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ::vector((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
            *)0x1e0f0a);
  SimInfo::getSimParams(*(SimInfo **)(in_RDI + 8));
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1e0f32);
  DumpReader::DumpReader
            (in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8,in_stack_ffffffffffffece0);
  iVar3 = DumpReader::getNFrames(in_stack_ffffffffffffea90);
  for (local_1370 = 0; local_1370 < iVar3; local_1370 = *(int *)(in_RDI + 0x30) + local_1370) {
    DumpReader::readFrame
              ((DumpReader *)CONCAT17(in_stack_ffffffffffffeb27,in_stack_ffffffffffffeb20),
               (int)((ulong)in_stack_ffffffffffffeb18 >> 0x20));
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    pSVar7 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)(in_RDI + 200) = pSVar7;
    bVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x2a0));
    if (bVar2) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffeac8);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_ffffffffffffeaa0._M_current,
                 (SelectionSet *)in_stack_ffffffffffffea98._M_current);
      SelectionSet::~SelectionSet((SelectionSet *)0x1e1084);
    }
    in_stack_ffffffffffffeb27 =
         SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x7f0));
    if ((bool)in_stack_ffffffffffffeb27) {
      in_stack_ffffffffffffeb18 = in_RDI + 0x1d8;
      SelectionEvaluator::evaluate(in_stack_ffffffffffffeac8);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_ffffffffffffeaa0._M_current,
                 (SelectionSet *)in_stack_ffffffffffffea98._M_current);
      SelectionSet::~SelectionSet((SelectionSet *)0x1e115b);
    }
    pSVar7 = (Snapshot *)
             SelectionManager::beginSelected
                       ((SelectionManager *)in_stack_ffffffffffffeaa0._M_current,
                        (int *)in_stack_ffffffffffffea98._M_current);
    local_10 = pSVar7;
    while (local_10 != (Snapshot *)0x0) {
      iVar4 = StuntDouble::getGlobalIndex((StuntDouble *)local_10);
      local_d8 = 1.0;
      local_2c = iVar4;
      std::
      vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
      ::clear((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
               *)0x1e120b);
      local_18 = SelectionManager::beginSelected
                           ((SelectionManager *)in_stack_ffffffffffffeaa0._M_current,
                            (int *)in_stack_ffffffffffffea98._M_current);
      while (local_18 != (StuntDouble *)0x0) {
        iVar5 = StuntDouble::getGlobalIndex(local_18);
        if (iVar5 != local_2c) {
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea98._M_current);
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea98._M_current);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea98._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffea90);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffea98._M_current,
                     (Vector<double,_3U> *)in_stack_ffffffffffffea90);
          if (bVar1) {
            Snapshot::wrapVector(pSVar7,(Vector3d *)CONCAT44(iVar4,in_stack_ffffffffffffeb08));
          }
          local_c8 = Vector<double,_3U>::length((Vector<double,_3U> *)0x1e1309);
          if (local_c8 < *(double *)(in_RDI + 0xd40)) {
            std::make_pair<double&,OpenMD::StuntDouble*&>
                      ((double *)in_stack_ffffffffffffea90,(StuntDouble **)in_stack_ffffffffffffea88
                      );
            std::
            vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
            ::push_back((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                         *)in_stack_ffffffffffffea90,(value_type *)in_stack_ffffffffffffea88);
          }
        }
        local_18 = SelectionManager::nextSelected
                             ((SelectionManager *)in_stack_ffffffffffffeaa0._M_current,
                              (int *)in_stack_ffffffffffffea98._M_current);
      }
      std::
      vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
      ::begin((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
               *)in_stack_ffffffffffffea88);
      std::
      vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
      ::end((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
             *)in_stack_ffffffffffffea88);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::StuntDouble*>*,std::vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>>>
                (in_stack_ffffffffffffeaa0,in_stack_ffffffffffffea98);
      sVar8 = std::
              vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
              ::size(&local_f0);
      if (sVar8 < 5) {
        in_stack_ffffffffffffeac8 =
             (SelectionEvaluator *)
             std::
             vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
             ::size(&local_f0);
      }
      else {
        in_stack_ffffffffffffeac8 = (SelectionEvaluator *)0x4;
      }
      iVar5 = (int)in_stack_ffffffffffffeac8;
      iVar6 = (int)((double)(iVar5 * (iVar5 + -1)) * 0.5);
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea98._M_current);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffea90,
                 (Vector3<double> *)in_stack_ffffffffffffea88);
      for (local_142c = 0; local_142c < iVar5 + -1; local_142c = local_142c + 1) {
        pvVar9 = std::
                 vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                 ::operator[](&local_f0,(long)local_142c);
        local_20 = pvVar9->second;
        StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea98._M_current);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_ffffffffffffea90,
                   (Vector3<double> *)in_stack_ffffffffffffea88);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea98._M_current,
                          (Vector<double,_3U> *)in_stack_ffffffffffffea90);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_ffffffffffffea98._M_current,
                   (Vector<double,_3U> *)in_stack_ffffffffffffea90);
        if (bVar1) {
          Snapshot::wrapVector(pSVar7,(Vector3d *)CONCAT44(iVar4,in_stack_ffffffffffffeb08));
        }
        Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffea90);
        local_1464 = local_142c;
        while (local_1464 = local_1464 + 1, local_1464 < iVar5) {
          pvVar9 = std::
                   vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                   ::operator[](&local_f0,(long)local_1464);
          local_28 = pvVar9->second;
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffea98._M_current);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffea90,
                     (Vector3<double> *)in_stack_ffffffffffffea88);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffea98._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffea90);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffea98._M_current,
                     (Vector<double,_3U> *)in_stack_ffffffffffffea90);
          if (bVar1) {
            Snapshot::wrapVector(pSVar7,(Vector3d *)CONCAT44(iVar4,in_stack_ffffffffffffeb08));
          }
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffea90);
          local_d0 = dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffeaa0._M_current,
                                    (Vector<double,_3U> *)in_stack_ffffffffffffea98._M_current);
          _Var11 = std::pow<double,int>
                             ((double)in_stack_ffffffffffffea90,
                              (int)((ulong)in_stack_ffffffffffffea88 >> 0x20));
          local_d8 = local_d8 - (_Var11 * 2.25) / (double)iVar6;
        }
      }
      if (0 < iVar6) {
        iVar4 = (int)((local_d8 - *(double *)(in_RDI + 0xd50)) / *(double *)(in_RDI + 0xd60));
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd70));
        if ((iVar4 < (int)sVar8) && (-1 < iVar4)) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd70),(long)iVar4);
          *pvVar10 = *pvVar10 + 1;
        }
        else {
          this_01 = std::operator<<((ostream *)&std::cerr,"binNo = ");
          in_stack_ffffffffffffeaa0._M_current =
               (pair<double,_OpenMD::StuntDouble_*> *)std::ostream::operator<<(this_01,iVar4);
          in_stack_ffffffffffffea98._M_current =
               (pair<double,_OpenMD::StuntDouble_*> *)
               std::operator<<((ostream *)in_stack_ffffffffffffeaa0._M_current," Qk = ");
          in_stack_ffffffffffffea90 =
               (DumpReader *)std::ostream::operator<<(in_stack_ffffffffffffea98._M_current,local_d8)
          ;
          std::operator<<((ostream *)in_stack_ffffffffffffea90,"\n");
        }
        *(int *)(in_RDI + 0xd68) = *(int *)(in_RDI + 0xd68) + 1;
      }
      in_stack_ffffffffffffea88 =
           (Snapshot *)
           SelectionManager::nextSelected
                     ((SelectionManager *)in_stack_ffffffffffffeaa0._M_current,
                      (int *)in_stack_ffffffffffffea98._M_current);
      local_10 = in_stack_ffffffffffffea88;
    }
  }
  writeQdens(in_stack_ffffffffffffed10);
  DumpReader::~DumpReader(in_stack_ffffffffffffea90);
  std::
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ::~vector((vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
             *)in_stack_ffffffffffffeaa0._M_current);
  return;
}

Assistant:

void TetrahedralityParamDens::process() {
    StuntDouble* sd;
    StuntDouble* sd2;
    StuntDouble* sdi;
    StuntDouble* sdj;
    int myIndex;
    Vector3d vec;
    Vector3d ri, rj, rk, rik, rkj;
    RealType r;
    RealType cospsi;
    RealType Qk;
    std::vector<std::pair<RealType, StuntDouble*>> myNeighbors;
    int isd1;
    int isd2;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      // Mat3x3d hmat = currentSnapshot_->getHmat();
      // zBox_.push_back(hmat(2,2));

      // RealType halfBoxZ_ = hmat(2,2) / 2.0;

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:
      for (sd = seleMan1_.beginSelected(isd1); sd != NULL;
           sd = seleMan1_.nextSelected(isd1)) {
        myIndex = sd->getGlobalIndex();

        Qk = 1.0;
        myNeighbors.clear();

        for (sd2 = seleMan2_.beginSelected(isd2); sd2 != NULL;
             sd2 = seleMan2_.nextSelected(isd2)) {
          if (sd2->getGlobalIndex() != myIndex) {
            vec = sd->getPos() - sd2->getPos();

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            r = vec.length();

            // Check to see if neighbor is in bond cutoff

            if (r < rCut_) {
              myNeighbors.push_back(std::make_pair(r, sd2));
              if (myIndex == 513) {
                // std::cerr<< "sd2 index = " << sd2->getGlobalIndex() << "\n";
              }
            }
          }
        }

        // Sort the vector using predicate and std::sort
        std::sort(myNeighbors.begin(), myNeighbors.end());

        // Use only the 4 closest neighbors to do the rest of the work:

        int nbors = myNeighbors.size() > 4 ? 4 : myNeighbors.size();
        int nang  = int(0.5 * (nbors * (nbors - 1)));
        if (nang < 4) {
          // std::cerr << "nbors = " << nbors << " nang = " << nang << "\n";
        }
        rk = sd->getPos();

        for (int i = 0; i < nbors - 1; i++) {
          sdi = myNeighbors[i].second;
          ri  = sdi->getPos();
          rik = rk - ri;
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rik);

          rik.normalize();

          for (int j = i + 1; j < nbors; j++) {
            sdj = myNeighbors[j].second;
            rj  = sdj->getPos();
            rkj = rk - rj;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rkj);
            rkj.normalize();

            cospsi = dot(rik, rkj);

            // Calculates scaled Qk for each molecule using calculated
            // angles from 4 or fewer nearest neighbors.
            Qk -= (pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang);
            /*if (Qk < 0 ) {
            std::cerr << "(pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang)" <<
            (pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang) << "\n"; std::cerr << "Qk
            = " << Qk << " nang = " << nang <<  " nbors = " << nbors << "\n";
            std::cerr << "myIndex = " << myIndex <<
            "\n";
            }*/
          }
        }

        // Based on the molecule's q value, populate the histogram.
        if (nang > 0) {
          int binNo = int((Qk - MinQ_) / deltaQ_);

          if (binNo < int(sliceCount_.size()) && binNo >= 0) {
            sliceCount_[binNo] += 1;
          } else {
            std::cerr << "binNo = " << binNo << " Qk = " << Qk << "\n";
            // std::cerr << "nbors = " << nbors << "\n";
          }

          // std::cout << "count = " << count_ << "\n";
          count_++;
        }
      }
    }
    writeQdens();
  }